

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::PrintTestPartResultToString_abi_cxx11_(TestPartResult *test_part_result)

{
  Type type;
  Message *this;
  TestPartResult *in_RSI;
  string *in_RDI;
  int in_stack_00000014;
  char *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  TestPartResult *in_stack_ffffffffffffff60;
  string local_38 [40];
  TestPartResult *local_10;
  
  local_10 = in_RSI;
  Message::Message((Message *)in_RDI);
  TestPartResult::file_name(in_stack_ffffffffffffff60);
  TestPartResult::line_number(local_10);
  FormatFileLocation_abi_cxx11_(in_stack_00000018,in_stack_00000014);
  Message::operator<<((Message *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  Message::operator<<((Message *)in_stack_ffffffffffffff60,(char (*) [2])in_stack_ffffffffffffff58);
  type = TestPartResult::type(local_10);
  TestPartResultTypeToString(type);
  this = Message::operator<<((Message *)in_stack_ffffffffffffff60,(char **)in_stack_ffffffffffffff58
                            );
  TestPartResult::message((TestPartResult *)0x17c176);
  Message::operator<<((Message *)in_stack_ffffffffffffff60,(char **)in_stack_ffffffffffffff58);
  Message::GetString_abi_cxx11_(this);
  std::__cxx11::string::~string(local_38);
  Message::~Message((Message *)0x17c1b9);
  return in_RDI;
}

Assistant:

static std::string PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}